

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

char * google::protobuf::internal::WireFormat::_InternalParseAndMergeField
                 (Message *msg,char *ptr,ParseContext *ctx,uint64_t tag,Reflection *reflection,
                 FieldDescriptor *field)

{
  byte bVar1;
  ushort uVar2;
  MessageFactory *factory;
  anon_class_32_4_91646d40 add;
  Message *pMVar3;
  undefined1 uVar4;
  uint32_t uVar5;
  int iVar6;
  CppStringType CVar7;
  MessageLite *msg_00;
  RepeatedField<double> *object;
  UnknownFieldSet *pUVar8;
  char *pcVar9;
  double dVar10;
  Descriptor *this;
  FieldDescriptor *pFVar11;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar12;
  RepeatedField<long> *pRVar13;
  RepeatedField<unsigned_int> *pRVar14;
  RepeatedField<bool> *object_00;
  RepeatedField<float> *object_01;
  RepeatedField<unsigned_long> *pRVar15;
  RepeatedField<int> *pRVar16;
  Nonnull<const_char_*> pcVar17;
  undefined8 extraout_RAX;
  bool bVar18;
  long lVar19;
  _Alloc_hider _Var20;
  double *pdVar21;
  uint uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  Metadata MVar24;
  pair<const_char_*,_int> pVar25;
  pair<const_char_*,_unsigned_long> pVar26;
  pair<const_char_*,_unsigned_long> pVar27;
  pair<const_char_*,_unsigned_long> pVar28;
  pair<const_char_*,_unsigned_int> pVar29;
  string_view field_name;
  string_view field_name_00;
  string value;
  double *local_c8;
  Message *local_c0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  double local_98;
  string local_90;
  string local_70;
  RepeatedField<int> *local_50;
  FieldDescriptor *pFStack_48;
  Reflection *local_40;
  Message *pMStack_38;
  
  local_c8 = (double *)ptr;
  if (field == (FieldDescriptor *)0x0) {
LAB_0026fff2:
    pUVar8 = Reflection::MutableUnknownFields(reflection,msg);
    pcVar9 = UnknownFieldParse(tag,pUVar8,(char *)local_c8,ctx);
    return pcVar9;
  }
  uVar22 = (uint)tag & 7;
  pFVar11 = field;
  if (uVar22 != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)field->type_ * 4)) {
    bVar1 = field->field_0x1;
    bVar18 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar18) {
      pcVar17 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar18,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar17 == (Nonnull<const_char_*>)0x0) {
      if (((uVar22 != 2) || ((field->field_0x1 & 0x20) == 0)) || (0xfffffffb < field->type_ - 0xd))
      goto LAB_0026fff2;
      switch(field->type_) {
      case '\x01':
        object = Reflection::MutableRepeatedFieldInternal<double>(reflection,msg,field);
        pcVar9 = PackedDoubleParser(object,(char *)local_c8,ctx);
        return pcVar9;
      case '\x02':
        object_01 = Reflection::MutableRepeatedFieldInternal<float>(reflection,msg,field);
        pcVar9 = PackedFloatParser(object_01,(char *)local_c8,ctx);
        return pcVar9;
      case '\x03':
        pRVar13 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
        pcVar9 = PackedInt64Parser(pRVar13,(char *)local_c8,ctx);
        return pcVar9;
      case '\x04':
        pRVar15 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
        pcVar9 = PackedUInt64Parser(pRVar15,(char *)local_c8,ctx);
        return pcVar9;
      case '\x05':
        pRVar16 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
        pcVar9 = PackedInt32Parser(pRVar16,(char *)local_c8,ctx);
        return pcVar9;
      case '\x06':
        pRVar15 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
        pcVar9 = PackedFixed64Parser(pRVar15,(char *)local_c8,ctx);
        return pcVar9;
      case '\a':
        pRVar14 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
        pcVar9 = PackedFixed32Parser(pRVar14,(char *)local_c8,ctx);
        return pcVar9;
      case '\b':
        object_00 = Reflection::MutableRepeatedFieldInternal<bool>(reflection,msg,field);
        pcVar9 = PackedBoolParser(object_00,(char *)local_c8,ctx);
        return pcVar9;
      case '\t':
      case '\n':
      case '\v':
      case '\f':
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8.as_tree,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                   ,0x378);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_b8.as_tree,(char (*) [12])"Can\'t reach");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8.as_tree);
      case '\r':
        pRVar14 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
        pcVar9 = PackedUInt32Parser(pRVar14,(char *)local_c8,ctx);
        return pcVar9;
      case '\x0e':
        pRVar16 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
        bVar18 = FieldDescriptor::legacy_enum_field_treated_as_closed(field);
        if (!bVar18) {
          pcVar9 = PackedEnumParser(pRVar16,(char *)local_c8,ctx);
          return pcVar9;
        }
        add.field = field;
        add.rep_enum = pRVar16;
        add.reflection = reflection;
        add.msg = msg;
        local_50 = pRVar16;
        pFStack_48 = field;
        local_40 = reflection;
        pMStack_38 = msg;
        pcVar9 = EpsCopyInputStream::
                 ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           (&ctx->super_EpsCopyInputStream,(char *)local_c8,add);
        return pcVar9;
      case '\x0f':
        pRVar16 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
        pcVar9 = PackedSFixed32Parser(pRVar16,(char *)local_c8,ctx);
        return pcVar9;
      case '\x10':
        pRVar13 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
        pcVar9 = PackedSFixed64Parser(pRVar13,(char *)local_c8,ctx);
        return pcVar9;
      case '\x11':
        pRVar16 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
        pcVar9 = PackedSInt32Parser(pRVar16,(char *)local_c8,ctx);
        return pcVar9;
      case '\x12':
        pRVar13 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
        pcVar9 = PackedSInt64Parser(pRVar13,(char *)local_c8,ctx);
        return pcVar9;
      }
      goto switchD_0026ffcd_default;
    }
LAB_00270afb:
    _InternalParseAndMergeField();
LAB_00270b08:
    _InternalParseAndMergeField();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.as_tree.cordz_info != &local_a8) {
      operator_delete((void *)local_b8.as_tree.cordz_info,
                      CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
switchD_0026ffcd_default:
  pdVar21 = local_c8;
  uVar4 = 0;
  local_c0 = msg;
  switch(field->type_) {
  case '\x01':
    local_98 = *local_c8;
    local_c8 = local_c8 + 1;
    bVar18 = FieldDescriptor::is_repeated(field);
    if (bVar18) {
      Reflection::AddDouble(reflection,local_c0,field,local_98);
      return (char *)local_c8;
    }
    Reflection::SetDouble(reflection,local_c0,field,local_98);
    return (char *)local_c8;
  case '\x02':
    local_98 = (double)CONCAT44(local_98._4_4_,*(uint32_t *)local_c8);
    local_c8 = (double *)((long)local_c8 + 4);
    bVar18 = FieldDescriptor::is_repeated(field);
    if (bVar18) {
      Reflection::AddFloat(reflection,local_c0,field,local_98._0_4_);
      return (char *)local_c8;
    }
    Reflection::SetFloat(reflection,local_c0,field,local_98._0_4_);
    return (char *)local_c8;
  case '\x03':
    lVar19 = 0;
    do {
      lVar19 = lVar19 + 1;
    } while (lVar19 != 10);
    bVar1 = *(byte *)local_c8;
    if ((long)(char)bVar1 < 0) {
      pVar26 = VarintParseSlow64((char *)local_c8,(uint)bVar1);
    }
    else {
      pVar26.second = (long)(char)bVar1;
      pVar26.first = (char *)((long)local_c8 + 1);
    }
    pMVar3 = local_c0;
    dVar10 = (double)pVar26.second;
    local_c8 = (double *)pVar26.first;
    if (local_c8 == (double *)0x0) {
      return (char *)0x0;
    }
    bVar18 = FieldDescriptor::is_repeated(field);
    goto joined_r0x00270201;
  case '\x04':
    lVar19 = 0;
    do {
      lVar19 = lVar19 + 1;
    } while (lVar19 != 10);
    bVar1 = *(byte *)local_c8;
    if ((long)(char)bVar1 < 0) {
      pVar27 = VarintParseSlow64((char *)local_c8,(uint)bVar1);
    }
    else {
      pVar27.second = (long)(char)bVar1;
      pVar27.first = (char *)((long)local_c8 + 1);
    }
    pMVar3 = local_c0;
    dVar10 = (double)pVar27.second;
    local_c8 = (double *)pVar27.first;
    if (local_c8 != (double *)0x0) {
      bVar18 = FieldDescriptor::is_repeated(field);
      goto joined_r0x00270235;
    }
    break;
  case '\x05':
    lVar19 = 0;
    do {
      lVar19 = lVar19 + 1;
    } while (lVar19 != 10);
    bVar1 = *(byte *)local_c8;
    uVar5 = (uint32_t)bVar1;
    if ((char)bVar1 < '\0') {
      pVar29 = VarintParseSlow32((char *)local_c8,(uint)bVar1);
      local_c8 = (double *)pVar29.first;
      uVar5 = pVar29.second;
    }
    else {
      local_c8 = (double *)((long)local_c8 + 1);
    }
    pMVar3 = local_c0;
    if (local_c8 == (double *)0x0) {
      return (char *)0x0;
    }
    bVar18 = FieldDescriptor::is_repeated(field);
    goto joined_r0x0027005a;
  case '\x06':
    dVar10 = *local_c8;
    local_c8 = local_c8 + 1;
    bVar18 = FieldDescriptor::is_repeated(field);
    pMVar3 = local_c0;
joined_r0x00270235:
    if (bVar18) {
      Reflection::AddUInt64(reflection,pMVar3,field,(uint64_t)dVar10);
      return (char *)local_c8;
    }
    Reflection::SetUInt64(reflection,pMVar3,field,(uint64_t)dVar10);
    return (char *)local_c8;
  case '\a':
    uVar5 = *(uint32_t *)local_c8;
    local_c8 = (double *)((long)local_c8 + 4);
    bVar18 = FieldDescriptor::is_repeated(field);
    pMVar3 = local_c0;
joined_r0x002707e6:
    if (bVar18) {
      Reflection::AddUInt32(reflection,pMVar3,field,uVar5);
      return (char *)local_c8;
    }
    Reflection::SetUInt32(reflection,pMVar3,field,uVar5);
    return (char *)local_c8;
  case '\b':
    lVar19 = 0;
    do {
      lVar19 = lVar19 + 1;
    } while (lVar19 != 10);
    bVar1 = *(byte *)local_c8;
    if ((long)(char)bVar1 < 0) {
      pVar28 = VarintParseSlow64((char *)local_c8,(uint)bVar1);
    }
    else {
      pVar28.second = (long)(char)bVar1;
      pVar28.first = (char *)((long)local_c8 + 1);
    }
    pMVar3 = local_c0;
    local_c8 = (double *)pVar28.first;
    if (local_c8 != (double *)0x0) {
      bVar18 = FieldDescriptor::is_repeated(field);
      if (bVar18) {
        Reflection::AddBool(reflection,pMVar3,field,pVar28.second != 0);
        return (char *)local_c8;
      }
      Reflection::SetBool(reflection,pMVar3,field,pVar28.second != 0);
      return (char *)local_c8;
    }
    break;
  case '\t':
    uVar4 = FieldDescriptor::requires_utf8_validation(field);
    bVar18 = true;
    goto LAB_0027028b;
  case '\n':
  case '\v':
    bVar1 = field->field_0x1;
    bVar18 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar18) {
      pcVar17 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar18,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar17 != (Nonnull<const_char_*>)0x0) goto LAB_00270b08;
    factory = (ctx->data_).factory;
    if ((field->field_0x1 & 0x20) == 0) {
      msg_00 = &Reflection::MutableMessage(reflection,local_c0,field,factory)->super_MessageLite;
    }
    else {
      msg_00 = &Reflection::AddMessage(reflection,local_c0,field,factory)->super_MessageLite;
    }
    if (uVar22 == 3) {
      pcVar9 = ParseContext::ParseGroup(ctx,msg_00,(char *)pdVar21,(uint)tag);
      return pcVar9;
    }
    if (uVar22 == 2) {
      pcVar9 = ParseContext::ParseMessage(ctx,msg_00,(char *)pdVar21);
      if (pcVar9 == (char *)0x0) {
        return (char *)0x0;
      }
      if (field->type_ != '\v') {
        return pcVar9;
      }
      bVar18 = FieldDescriptor::is_map_message_type(field);
      if (!bVar18) {
        return pcVar9;
      }
      this = FieldDescriptor::message_type(field);
      pFVar11 = Descriptor::map_value(this);
      this_00 = FieldDescriptor::enum_type(pFVar11);
      if (this_00 == (EnumDescriptor *)0x0) {
        return pcVar9;
      }
      bVar18 = cpp::HasPreservingUnknownEnumSemantics(pFVar11);
      if (bVar18) {
        return pcVar9;
      }
      MVar24 = Message::GetMetadata((Message *)msg_00);
      iVar6 = Reflection::GetEnumValue(MVar24.reflection,(Message *)msg_00,pFVar11);
      pEVar12 = EnumDescriptor::FindValueByNumber(this_00,iVar6);
      if (pEVar12 != (EnumValueDescriptor *)0x0) {
        return pcVar9;
      }
      pUVar8 = Reflection::MutableUnknownFields(reflection,local_c0);
      iVar6 = field->number_;
      MessageLite::SerializeAsString_abi_cxx11_((string *)&local_b8.as_tree,msg_00);
      UnknownFieldSet::AddLengthDelimited<>(pUVar8,iVar6,(string *)&local_b8.as_tree);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.as_tree.cordz_info != &local_a8) {
        operator_delete((void *)local_b8.as_tree.cordz_info,
                        CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1)
        ;
      }
      Reflection::RemoveLast(reflection,local_c0,field);
      return pcVar9;
    }
    _InternalParseAndMergeField((WireFormat *)&local_b8.as_tree);
    goto LAB_00270afb;
  case '\f':
    bVar18 = false;
LAB_0027028b:
    bVar1 = *(byte *)local_c8;
    uVar22 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar25 = ReadSizeFallback((char *)local_c8,(uint)bVar1);
      local_c8 = (double *)pVar25.first;
      uVar22 = pVar25.second;
    }
    else {
      local_c8 = (double *)((long)local_c8 + 1);
    }
    if (local_c8 == (double *)0x0) {
      return (char *)0x0;
    }
    CVar7 = FieldDescriptor::cpp_string_type(field);
    if (CVar7 == kCord) {
      local_b8.as_tree.cordz_info = 0;
      local_b8.as_tree.rep = (CordRep *)0x0;
      local_c8 = (double *)
                 EpsCopyInputStream::ReadCord
                           (&ctx->super_EpsCopyInputStream,(char *)local_c8,uVar22,
                            (Cord *)&local_b8.as_tree);
      if (local_c8 == (double *)0x0) {
        pdVar21 = (double *)0x0;
      }
      else {
        Reflection::SetString(reflection,local_c0,field,(Cord *)&local_b8.as_tree);
        pdVar21 = local_c8;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_b8.as_tree);
      return (char *)pdVar21;
    }
    local_b8.as_tree.cordz_info = (cordz_info_t)&local_a8;
    local_b8.as_tree.rep = (CordRep *)0x0;
    local_a8._M_local_buf[0] = '\0';
    local_c8 = (double *)
               EpsCopyInputStream::ReadString
                         (&ctx->super_EpsCopyInputStream,(char *)local_c8,uVar22,
                          (string *)&local_b8.as_tree);
    if (local_c8 == (double *)0x0) {
LAB_002704f9:
      pdVar21 = (double *)0x0;
    }
    else {
      if (bVar18) {
        pcVar9 = (field->all_names_).payload_;
        uVar2 = *(ushort *)(pcVar9 + 2);
        field_name._M_len = pcVar9 + ~(ulong)uVar2;
        if (uVar4 == '\0') {
          field_name_00._M_str = (char *)pFVar11;
          field_name_00._M_len = (size_t)field_name._M_len;
          WireFormatLite::VerifyUtf8String
                    ((WireFormatLite *)local_b8.as_tree.cordz_info,
                     (char *)((ulong)local_b8.as_tree.rep & 0xffffffff),0,(uint)uVar2,field_name_00)
          ;
        }
        else {
          field_name._M_str = (char *)pFVar11;
          bVar18 = WireFormatLite::VerifyUtf8String
                             ((WireFormatLite *)local_b8.as_tree.cordz_info,
                              (char *)((ulong)local_b8.as_tree.rep & 0xffffffff),0,(uint)uVar2,
                              field_name);
          if (!bVar18) goto LAB_002704f9;
        }
      }
      bVar18 = FieldDescriptor::is_repeated(field);
      if (bVar18) {
        paVar23 = &local_70.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8.as_tree.cordz_info == &local_a8) {
          local_70.field_2._8_8_ = local_a8._8_8_;
          local_70._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_70._M_dataplus._M_p = (pointer)local_b8.as_tree.cordz_info;
        }
        local_70.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
        local_70.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
        local_70._M_string_length = (size_type)local_b8.as_tree.rep;
        local_b8.as_tree.rep = (CordRep *)0x0;
        local_a8._M_local_buf[0] = '\0';
        local_b8.as_tree.cordz_info = (cordz_info_t)&local_a8;
        Reflection::AddString(reflection,local_c0,field,&local_70);
        _Var20._M_p = local_70._M_dataplus._M_p;
      }
      else {
        paVar23 = &local_90.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8.as_tree.cordz_info == &local_a8) {
          local_90.field_2._8_8_ = local_a8._8_8_;
          local_90._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_90._M_dataplus._M_p = (pointer)local_b8.as_tree.cordz_info;
        }
        local_90.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
        local_90.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
        local_90._M_string_length = (size_type)local_b8.as_tree.rep;
        local_b8.as_tree.rep = (CordRep *)0x0;
        local_a8._M_local_buf[0] = '\0';
        local_b8.as_tree.cordz_info = (cordz_info_t)&local_a8;
        Reflection::SetString(reflection,local_c0,field,&local_90);
        _Var20._M_p = local_90._M_dataplus._M_p;
      }
      pdVar21 = local_c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var20._M_p != paVar23) {
        operator_delete(_Var20._M_p,paVar23->_M_allocated_capacity + 1);
        pdVar21 = local_c8;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.as_tree.cordz_info == &local_a8) {
      return (char *)pdVar21;
    }
    operator_delete((void *)local_b8.as_tree.cordz_info,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
    return (char *)pdVar21;
  case '\r':
    lVar19 = 0;
    do {
      lVar19 = lVar19 + 1;
    } while (lVar19 != 10);
    bVar1 = *(byte *)local_c8;
    uVar5 = (uint32_t)bVar1;
    if ((char)bVar1 < '\0') {
      pVar29 = VarintParseSlow32((char *)local_c8,(uint)bVar1);
      local_c8 = (double *)pVar29.first;
      uVar5 = pVar29.second;
    }
    else {
      local_c8 = (double *)((long)local_c8 + 1);
    }
    pMVar3 = local_c0;
    if (local_c8 != (double *)0x0) {
      bVar18 = FieldDescriptor::is_repeated(field);
      goto joined_r0x002707e6;
    }
    break;
  case '\x0e':
    lVar19 = 0;
    do {
      lVar19 = lVar19 + 1;
    } while (lVar19 != 10);
    bVar1 = *(byte *)local_c8;
    uVar22 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar29 = VarintParseSlow32((char *)local_c8,(uint)bVar1);
      local_c8 = (double *)pVar29.first;
      uVar22 = pVar29.second;
    }
    else {
      local_c8 = (double *)((long)local_c8 + 1);
    }
    pMVar3 = local_c0;
    if (local_c8 != (double *)0x0) {
      bVar18 = FieldDescriptor::is_repeated(field);
      if (bVar18) {
        Reflection::AddEnumValue(reflection,pMVar3,field,uVar22);
        return (char *)local_c8;
      }
      Reflection::SetEnumValue(reflection,pMVar3,field,uVar22);
      return (char *)local_c8;
    }
    break;
  case '\x0f':
    uVar5 = *(uint32_t *)local_c8;
    local_c8 = (double *)((long)local_c8 + 4);
    goto LAB_0027004d;
  case '\x10':
    dVar10 = *local_c8;
    local_c8 = local_c8 + 1;
    goto LAB_002701f4;
  case '\x11':
    uVar5 = ReadVarintZigZag32((char **)&local_c8);
    if (local_c8 == (double *)0x0) {
      return (char *)0x0;
    }
LAB_0027004d:
    bVar18 = FieldDescriptor::is_repeated(field);
    pMVar3 = local_c0;
joined_r0x0027005a:
    if (bVar18) {
      Reflection::AddInt32(reflection,pMVar3,field,uVar5);
      return (char *)local_c8;
    }
    Reflection::SetInt32(reflection,pMVar3,field,uVar5);
    return (char *)local_c8;
  case '\x12':
    dVar10 = (double)ReadVarintZigZag64((char **)&local_c8);
    if (local_c8 == (double *)0x0) {
      return (char *)0x0;
    }
LAB_002701f4:
    bVar18 = FieldDescriptor::is_repeated(field);
    pMVar3 = local_c0;
joined_r0x00270201:
    if (bVar18) {
      Reflection::AddInt64(reflection,pMVar3,field,(int64_t)dVar10);
      return (char *)local_c8;
    }
    Reflection::SetInt64(reflection,pMVar3,field,(int64_t)dVar10);
    return (char *)local_c8;
  }
  return (char *)0x0;
}

Assistant:

const char* WireFormat::_InternalParseAndMergeField(
    Message* msg, const char* ptr, internal::ParseContext* ctx, uint64_t tag,
    const Reflection* reflection, const FieldDescriptor* field) {
  if (field == nullptr) {
    // unknown field set parser takes 64bit tags, because message set type ids
    // span the full 32 bit range making the tag span [0, 2^35) range.
    return internal::UnknownFieldParse(
        tag, reflection->MutableUnknownFields(msg), ptr, ctx);
  }
  if (WireFormatLite::GetTagWireType(tag) !=
      WireTypeForFieldType(field->type())) {
    if (field->is_packable() && WireFormatLite::GetTagWireType(tag) ==
                                    WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    ptr = internal::Packed##CPPTYPE_METHOD##Parser(                         \
        reflection->MutableRepeatedFieldInternal<CPPTYPE>(msg, field), ptr, \
        ctx);                                                               \
    return ptr;                                                             \
  }

        HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
        HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
        HANDLE_PACKED_TYPE(SINT32, int32_t, SInt32)
        HANDLE_PACKED_TYPE(SINT64, int64_t, SInt64)
        HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
        HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

        HANDLE_PACKED_TYPE(FIXED32, uint32_t, Fixed32)
        HANDLE_PACKED_TYPE(FIXED64, uint64_t, Fixed64)
        HANDLE_PACKED_TYPE(SFIXED32, int32_t, SFixed32)
        HANDLE_PACKED_TYPE(SFIXED64, int64_t, SFixed64)

        HANDLE_PACKED_TYPE(FLOAT, float, Float)
        HANDLE_PACKED_TYPE(DOUBLE, double, Double)

        HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

        case FieldDescriptor::TYPE_ENUM: {
          auto rep_enum =
              reflection->MutableRepeatedFieldInternal<int>(msg, field);
          if (!field->legacy_enum_field_treated_as_closed()) {
            ptr = internal::PackedEnumParser(rep_enum, ptr, ctx);
          } else {
            return ctx->ReadPackedVarint(
                ptr, [rep_enum, field, reflection, msg](int32_t val) {
                  if (field->enum_type()->FindValueByNumber(val) != nullptr) {
                    rep_enum->Add(val);
                  } else {
                    WriteVarint(field->number(), val,
                                reflection->MutableUnknownFields(msg));
                  }
                });
          }
          return ptr;
        }

        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE:
        case FieldDescriptor::TYPE_BYTES:
          ABSL_LOG(FATAL) << "Can't reach";
          return nullptr;
      }
    } else {
      // mismatched wiretype;
      return internal::UnknownFieldParse(
          tag, reflection->MutableUnknownFields(msg), ptr, ctx);
    }
  }

  // Non-packed value
  bool utf8_check = false;
  bool strict_utf8_check = false;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    ptr = VarintParse(ptr, &value);                       \
    if (ptr == nullptr) return nullptr;                   \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

    HANDLE_TYPE(BOOL, uint64_t, Bool)
    HANDLE_TYPE(INT32, uint32_t, Int32)
    HANDLE_TYPE(INT64, uint64_t, Int64)
    HANDLE_TYPE(UINT32, uint32_t, UInt32)
    HANDLE_TYPE(UINT64, uint64_t, UInt64)

    case FieldDescriptor::TYPE_SINT32: {
      int32_t value = ReadVarintZigZag32(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt32(msg, field, value);
      } else {
        reflection->SetInt32(msg, field, value);
      }
      return ptr;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64_t value = ReadVarintZigZag64(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt64(msg, field, value);
      } else {
        reflection->SetInt64(msg, field, value);
      }
      return ptr;
    }
#undef HANDLE_TYPE
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    value = UnalignedLoad<CPPTYPE>(ptr);                  \
    ptr += sizeof(CPPTYPE);                               \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

#undef HANDLE_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      uint32_t value;
      ptr = VarintParse(ptr, &value);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      return ptr;
    }

    // Handle strings separately so that we can optimize the ctype=CORD case.
    case FieldDescriptor::TYPE_STRING:
      utf8_check = true;
      strict_utf8_check = field->requires_utf8_validation();
      ABSL_FALLTHROUGH_INTENDED;
    case FieldDescriptor::TYPE_BYTES: {
      int size = ReadSize(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        absl::Cord value;
        ptr = ctx->ReadCord(ptr, size, &value);
        if (ptr == nullptr) return nullptr;
        reflection->SetString(msg, field, value);
        return ptr;
      }
      std::string value;
      ptr = ctx->ReadString(ptr, size, &value);
      if (ptr == nullptr) return nullptr;
      if (utf8_check) {
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name())) {
            return nullptr;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name());
        }
      }
      if (field->is_repeated()) {
        reflection->AddString(msg, field, std::move(value));
      } else {
        reflection->SetString(msg, field, std::move(value));
      }
      return ptr;
    }

    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return HandleMessage(msg, ptr, ctx, tag, reflection, field);
  }

  // GCC 8 complains about control reaching end of non-void function here.
  // Let's keep it happy by returning a nullptr.
  return nullptr;
}